

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *seed,NetType network_type)

{
  size_type sVar1;
  CfdException *pCVar2;
  uchar *puVar3;
  ByteData local_1f0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0;
  CfdSourceLocation local_1b0;
  allocator<unsigned_char> local_191;
  undefined1 local_190 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_170;
  CfdSourceLocation local_150;
  int local_134;
  undefined1 local_130 [4];
  int ret;
  ext_key extkey;
  uint32_t version;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed_byte;
  NetType network_type_local;
  ByteData *seed_local;
  ExtPrivkey *this_local;
  
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,seed);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  if (sVar1 != 0x10) {
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    if (sVar1 != 0x20) {
      sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      if (sVar1 != 0x40) {
        extkey.pub_key_tweak_sum[0x1e] = '\x01';
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&version,"ExtPrivkey Seed length error.",
                   (allocator *)(extkey.pub_key_tweak_sum + 0x1f));
        CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&version);
        extkey.pub_key_tweak_sum[0x1e] = '\0';
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  extkey.pub_key_tweak_sum[0x18] = 0x94;
  extkey.pub_key_tweak_sum[0x19] = 0x83;
  extkey.pub_key_tweak_sum[0x1a] = '5';
  extkey.pub_key_tweak_sum[0x1b] = '\x04';
  if ((network_type == kMainnet) || (network_type == kLiquidV1)) {
    builtin_memcpy(extkey.pub_key_tweak_sum + 0x18,"䭈\x04",4);
  }
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_134 = bip32_key_from_seed(puVar3,sVar1,extkey.pub_key_tweak_sum._24_4_,0,local_130);
  if (local_134 != 0) {
    local_150.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_150.filename = local_150.filename + 1;
    local_150.line = 0x1b0;
    local_150.funcname = "ExtPrivkey";
    logger::warn<int&>(&local_150,"bip32_key_from_seed error. ret={}",&local_134);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_170,"ExtPrivkey gen from seed error.",
               (allocator *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_170);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_191);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190,0x4e,&local_191);
  ::std::allocator<unsigned_char>::~allocator(&local_191);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
  local_134 = bip32_key_serialize(local_130,0,puVar3,sVar1);
  if (local_134 != 0) {
    local_1b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_1b0.filename = local_1b0.filename + 1;
    local_1b0.line = 0x1b9;
    local_1b0.funcname = "ExtPrivkey";
    logger::warn<int&>(&local_1b0,"bip32_key_serialize error. ret={}",&local_134);
    local_1d2 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1d0,"ExtPrivkey serialize error.",&local_1d1);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_1d0);
    local_1d2 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_1f0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
  ByteData::operator=(&this->serialize_data_,&local_1f0);
  ByteData::~ByteData(&local_1f0);
  AnalyzeBip32KeyData(local_130,(string *)0x0,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&this->version_,
                      &this->depth_,&this->child_num_,&this->chaincode_,&this->privkey_,
                      (Pubkey *)0x0,&this->fingerprint_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(const ByteData& seed, NetType network_type) {
  std::vector<uint8_t> seed_byte = seed.GetBytes();
  if ((seed_byte.size() != HDWallet::kSeed128Size) &&
      (seed_byte.size() != HDWallet::kSeed256Size) &&
      (seed_byte.size() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey Seed length error.");
  }
  uint32_t version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    version = kVersionMainnetPrivkey;
  }

  struct ext_key extkey;
  int ret = bip32_key_from_seed(
      seed_byte.data(), seed_byte.size(), version, 0, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_seed error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey gen from seed error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}